

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void mmm01_write_rom(Emulator *e,MaskedAddress addr,u8 value)

{
  undefined6 in_register_00000032;
  ulong uVar1;
  
  uVar1 = CONCAT62(in_register_00000032,addr) >> 0xd & 0x7ffff;
  if ((short)uVar1 == 1) {
    (e->state).memory_map_state.field_3.mbc1.byte_2000_3fff = value;
  }
  else if ((int)uVar1 == 0) {
    uVar1 = e->cart_info->size;
    if ((uVar1 & uVar1 - 1) == 0) {
      set_cart_info(e,(u8)(((uint)(e->state).memory_map_state.field_3.mbc1.byte_2000_3fff << 0xe &
                           (int)uVar1 + 0x7fffffU) >> 0xf));
      return;
    }
    __assert_fail("(e->cart_info->size & (e->cart_info->size - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
                  0x61e,"void mmm01_write_rom(Emulator *, MaskedAddress, u8)");
  }
  return;
}

Assistant:

static void mmm01_write_rom(Emulator* e, MaskedAddress addr, u8 value) {
  Mmm01* mmm01 = &MMAP_STATE.mmm01;
  switch (addr >> 13) {
    case 0: { /* 0000-1fff */
      /* ROM size should be power-of-two. */
      assert((e->cart_info->size & (e->cart_info->size - 1)) == 0);
      u32 rom_offset =
          (mmm01->byte_2000_3fff << ROM_BANK_SHIFT) & (e->cart_info->size - 1);
      set_cart_info(e, rom_offset >> CART_INFO_SHIFT);
      break;
    }
    case 1: /* 2000-3fff */
      mmm01->byte_2000_3fff = value;
      break;
  }
}